

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::loadConstructedPoint<(TasGrid::RuleLocal::erule)4>
          (GridLocalPolynomial *this,double *x,vector<double,_std::allocator<double>_> *y)

{
  SimpleConstructData *pSVar1;
  int iVar2;
  int iVar3;
  int j;
  long lVar4;
  bool isConnected;
  vector<int,_std::allocator<int>_> p;
  NodeData local_50;
  
  getMultiIndex<(TasGrid::RuleLocal::erule)4>(&p,this,x);
  MultiIndexSet::removeIndex
            (&((this->dynamic_values)._M_t.
               super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
               .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl)->
              initial_points,(vector<int,_std::allocator<int>_> *)&p);
  isConnected = false;
  HierarchyManipulations::
  touchAllImmediateRelatives<(TasGrid::RuleLocal::erule)4,TasGrid::GridLocalPolynomial::loadConstructedPoint<(TasGrid::RuleLocal::erule)4>(double_const*,std::vector<double,std::allocator<double>>const&)::_lambda(int)_1_>
            (&p,&(this->super_BaseCanonicalGrid).points,(anon_class_8_1_35481f5f)&isConnected);
  iVar2 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)4>
                    (*p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  for (lVar4 = 1; lVar4 < (this->super_BaseCanonicalGrid).num_dimensions; lVar4 = lVar4 + 1) {
    iVar3 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)4>
                      (p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar4]);
    iVar2 = iVar2 + iVar3;
  }
  if ((isConnected == false) && (iVar2 != 0)) {
    pSVar1 = (this->dynamic_values)._M_t.
             super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
             .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl;
    ::std::vector<int,_std::allocator<int>_>::vector
              (&local_50.point,(vector<int,_std::allocator<int>_> *)&p);
    ::std::vector<double,_std::allocator<double>_>::vector
              (&local_50.value,(vector<double,_std::allocator<double>_> *)y);
    ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::push_front
              (&pSVar1->data,&local_50);
    NodeData::~NodeData(&local_50);
  }
  else {
    expandGrid<(TasGrid::RuleLocal::erule)4>(this,&p,y);
    loadConstructedPoints<(TasGrid::RuleLocal::erule)4>(this);
  }
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&p);
  return;
}

Assistant:

void GridLocalPolynomial::loadConstructedPoint(const double x[], const std::vector<double> &y){
    auto p = getMultiIndex<effrule>(x);

    dynamic_values->initial_points.removeIndex(p);

    bool isConnected = false;
    HierarchyManipulations::touchAllImmediateRelatives<effrule>(p, points, [&](int)->void{ isConnected = true; });
    int lvl = RuleLocal::getLevel<effrule>(p[0]);
    for(int j=1; j<num_dimensions; j++) lvl += RuleLocal::getLevel<effrule>(p[j]);

    if (isConnected || (lvl == 0)){
        expandGrid<effrule>(p, y);
        loadConstructedPoints<effrule>();
    }else{
        dynamic_values->data.push_front({p, y});
    }
}